

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profiler.hpp
# Opt level: O3

ssize_t __thiscall JEBDebug::Profiler::write(Profiler *this,int __fd,void *__buf,size_t __n)

{
  _Base_ptr p_Var1;
  long lVar2;
  long lVar3;
  pointer p_Var4;
  uint uVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  ostream *poVar8;
  ssize_t sVar9;
  uint uVar10;
  ostream *poVar11;
  undefined4 in_register_00000034;
  uint uVar12;
  ulong uVar13;
  pointer p_Var14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  _Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_> *it;
  double dVar18;
  undefined1 auVar19 [16];
  char local_61;
  ulong local_60;
  ulong local_58;
  ostream *local_50;
  pointer local_48;
  ulong local_40;
  Profiler *local_38;
  
  poVar11 = (ostream *)CONCAT44(in_register_00000034,__fd);
  p_Var14 = (this->sequence_).
            super__Vector_base<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (this->sequence_).
             super__Vector_base<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var14 == local_48) {
    uVar17 = 8;
    uVar13 = 3;
    poVar7 = (ostream *)0x5;
    local_58 = 3;
    local_60 = 3;
  }
  else {
    uVar15 = 5;
    uVar5 = 3;
    uVar16 = 8;
    uVar10 = 3;
    uVar12 = 3;
    local_50 = poVar11;
    local_38 = this;
    do {
      local_40 = CONCAT44(local_40._4_4_,uVar10);
      local_60 = CONCAT44(local_60._4_4_,uVar5);
      local_58 = CONCAT44(local_58._4_4_,uVar16);
      p_Var6 = p_Var14->_M_node;
      p_Var1 = p_Var6[2]._M_right;
      if (p_Var1 == (_Base_ptr)0x0) {
        uVar16 = 1;
      }
      else {
        auVar19._8_4_ = (int)((ulong)p_Var1 >> 0x20);
        auVar19._0_8_ = p_Var1;
        auVar19._12_4_ = 0x45300000;
        dVar18 = log10((auVar19._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)p_Var1) - 4503599627370496.0));
        dVar18 = ceil(dVar18);
        uVar16 = (uint)dVar18;
        p_Var6 = p_Var14->_M_node;
      }
      if ((int)uVar16 < (int)uVar15) {
        uVar16 = uVar15;
      }
      uVar15 = uVar16;
      dVar18 = (double)*(long *)(p_Var6 + 3) / 1000000000.0;
      if (0.0 <= dVar18) {
        uVar16 = 6;
        if (1.0 <= dVar18) {
          dVar18 = log10(dVar18);
          dVar18 = ceil(dVar18);
          uVar16 = (int)dVar18 + 5;
        }
      }
      else {
        dVar18 = log10(-dVar18);
        dVar18 = ceil(dVar18);
        uVar16 = (uint)(dVar18 + 6.0);
      }
      if ((int)uVar16 < (int)uVar12) {
        uVar16 = uVar12;
      }
      uVar12 = uVar16;
      dVar18 = (double)(long)p_Var14->_M_node[3]._M_parent / 1000000000.0;
      if (0.0 <= dVar18) {
        uVar10 = 6;
        if (1.0 <= dVar18) {
          dVar18 = log10(dVar18);
          dVar18 = ceil(dVar18);
          uVar10 = (int)dVar18 + 5;
        }
      }
      else {
        dVar18 = log10(-dVar18);
        dVar18 = ceil(dVar18);
        uVar10 = (uint)(dVar18 + 6.0);
      }
      if ((int)uVar10 < (int)(uint)local_40) {
        uVar10 = (uint)local_40;
      }
      dVar18 = (double)(long)p_Var14->_M_node[3]._M_left / 1000000000.0;
      if (0.0 <= dVar18) {
        uVar5 = 6;
        if (1.0 <= dVar18) {
          dVar18 = log10(dVar18);
          dVar18 = ceil(dVar18);
          uVar5 = (int)dVar18 + 5;
        }
      }
      else {
        dVar18 = log10(-dVar18);
        dVar18 = ceil(dVar18);
        uVar5 = (uint)(dVar18 + 6.0);
      }
      if ((int)uVar5 < (int)(uint)local_60) {
        uVar5 = (uint)local_60;
      }
      uVar16 = *(uint *)&p_Var14->_M_node[1]._M_left;
      if ((int)uVar16 < (int)(uint)local_58) {
        uVar16 = (uint)local_58;
      }
      p_Var14 = p_Var14 + 1;
    } while (p_Var14 != local_48);
    poVar7 = (ostream *)(ulong)uVar15;
    uVar13 = (ulong)uVar12;
    local_58 = (ulong)uVar10;
    local_60 = (ulong)uVar5;
    uVar17 = (ulong)uVar16;
    poVar11 = local_50;
    this = local_38;
  }
  lVar2 = *(long *)poVar11;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar11 + lVar3 + 0x18) = *(uint *)(poVar11 + lVar3 + 0x18) & 0xffffff4f | 0x80;
  *(ostream **)(poVar11 + *(long *)(lVar2 + -0x18) + 0x10) = poVar7;
  local_40 = uVar13;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"calls",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
  *(ulong *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x10) = uVar13;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"sum",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
  *(ulong *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x10) = local_58;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"min",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
  *(ulong *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x10) = local_60;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"max",3);
  *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
       *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  ",2);
  *(ulong *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x10) = uVar17;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"function",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  file\n",7);
  lVar2 = *(long *)poVar11;
  *(undefined8 *)(poVar11 + *(long *)(lVar2 + -0x18) + 8) = 4;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar11 + lVar2 + 0x18) = *(uint *)(poVar11 + lVar2 + 0x18) & 0xfffffefb | 4;
  p_Var14 = (this->sequence_).
            super__Vector_base<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var4 = (this->sequence_).
           super__Vector_base<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  poVar8 = poVar7;
  if (p_Var14 != p_Var4) {
    do {
      local_48 = p_Var4;
      local_50 = poVar8;
      p_Var6 = p_Var14->_M_node;
      lVar2 = *(long *)poVar11;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar11 + lVar3 + 0x18) = *(uint *)(poVar11 + lVar3 + 0x18) & 0xffffff4f | 0x80;
      *(ostream **)(poVar11 + *(long *)(lVar2 + -0x18) + 0x10) = poVar7;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      *(ulong *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = local_40;
      poVar7 = std::ostream::_M_insert<double>((double)*(long *)(p_Var6 + 3) / 1000000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      *(ulong *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = local_58;
      poVar7 = std::ostream::_M_insert<double>((double)(long)p_Var6[3]._M_parent / 1000000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      *(ulong *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = local_60;
      poVar7 = std::ostream::_M_insert<double>((double)(long)p_Var6[3]._M_left / 1000000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      lVar2 = *(long *)poVar7;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffff4f | 0x20;
      *(ulong *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = uVar17;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)p_Var6[1]._M_right,(long)p_Var6[1]._M_left);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)p_Var6[1]._M_parent,*(long *)(p_Var6 + 1));
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
      poVar7 = local_50;
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      local_61 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_61,1);
      p_Var14 = p_Var14 + 1;
      poVar8 = local_50;
      p_Var4 = local_48;
    } while (p_Var14 != local_48);
  }
  sVar9 = std::ostream::flush();
  return sVar9;
}

Assistant:

void write(std::ostream& os) const
        {
            auto int_width = [](auto n)
            {
                if (n == 0)
                    return 1;
                if (n < 0)
                    return int(std::ceil(std::log10(-n)) + 1);
                return int(std::ceil(std::log10(n)));
            };

            auto float_width = [](auto n)
            {
                if (n < 0)
                    return int(std::ceil(std::log10(-n)) + 6);
                if (n < 1)
                    return 6;
                return int(std::ceil(std::log10(n))) + 5;
            };

            int widths[5] = {5, 3, 3, 3, 8};
            for (const auto& it : sequence_)
            {
                widths[0] = std::max(widths[0], int_width(it->second.count()));
                widths[1] = std::max(widths[1], float_width(it->second.acc_time()));
                widths[2] = std::max(widths[2], float_width(it->second.min_time()));
                widths[3] = std::max(widths[3], float_width(it->second.max_time()));
                widths[4] = std::max(widths[4], int(it->first.func_name.size()));
            }
            using std::left, std::right, std::setw;
            os << right << setw(widths[0]) << "calls"
               << " " << setw(widths[1]) << "sum"
               << " " << setw(widths[2]) << "min"
               << " " << setw(widths[3]) << "max"
               << left << "  " << setw(widths[4]) << "function"
               << "  file\n";

            os << std::setprecision(4) << std::fixed;
            for (auto it : sequence_)
            {
                os << right << setw(widths[0]) << it->second.count()
                   << " " << setw(widths[1]) << it->second.acc_time()
                   << " " << setw(widths[2]) << it->second.min_time()
                   << " " << setw(widths[3]) << it->second.max_time()
                   << "  " << left << setw(widths[4]) << it->first.func_name
                   << "  " << it->first.file_name
                   #ifdef _MSC_VER
                   << "(" << it->first.line_no << ")"
                   #else
                   << ":" << it->first.line_no
                   #endif
                   << '\n';
            }
            os.flush();
        }